

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::readEncodingCompression(MatroskaDemuxer *this,MatroskaTrack *track)

{
  int *levelUp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  size_type __new_size;
  uint8_t *data;
  int size;
  int local_54;
  int32_t local_50;
  undefined4 uStack_4c;
  int local_48;
  uint32_t local_44;
  MatroskaTrack *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  local_54 = ebml_read_master(this,&local_44);
  if (-1 < local_54) {
    track->encodingAlgo = 0;
    levelUp = &this->level_up;
    local_38 = &track->encodingAlgoPriv;
    iVar3 = 0;
    do {
      if (iVar3 != 0) {
        return 0;
      }
      uVar2 = ebml_peek_id(this,levelUp);
      if (uVar2 == 0) {
        return 0;
      }
      iVar4 = *levelUp;
      if (0 < iVar4) break;
      if (uVar2 == 0x4255) {
        iVar3 = ebml_read_binary(this,&local_44,(uint8_t **)&local_50,&local_48);
        pvVar1 = local_38;
        if ((-1 < iVar3) && (__new_size = (size_type)local_48, 0 < (long)__new_size)) {
          local_40 = track;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_38,__new_size);
          track = local_40;
          memcpy((pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start,(void *)CONCAT44(uStack_4c,local_50),__new_size);
        }
      }
      else if (uVar2 == 0x4254) {
        iVar3 = ebml_read_uint(this,&local_44,(int64_t *)&local_50);
        if (-1 < iVar3) {
          track->encodingAlgo = local_50;
        }
      }
      else {
        iVar3 = ebml_read_skip(this);
      }
      iVar4 = *levelUp;
    } while (iVar4 == 0);
    local_54 = 0;
    *levelUp = iVar4 + -1;
  }
  return local_54;
}

Assistant:

int MatroskaDemuxer::readEncodingCompression(MatroskaTrack *track)
{
    int res;
    uint32_t id;

    if ((res = ebml_read_master(&id)) < 0)
        return res;

    track->encodingAlgo = 0;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            break;
        }
        if (level_up > 0)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        case MATROSKA_ID_ENCODINGCOMPALGO:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                break;
            track->encodingAlgo = static_cast<int32_t>(num);
            break;
        }
        case MATROSKA_ID_ENCODINGCOMPSETTINGS:
        {
            uint8_t *data;
            int size;
            if ((res = ebml_read_binary(&id, &data, &size)) < 0)
                break;
            if (size > 0)
            {
                track->encodingAlgoPriv.resize(size);
                memcpy(track->encodingAlgoPriv.data(), data, size);
            }
            break;
        }
        default:
            res = ebml_read_skip();
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }
    return 0;
}